

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

void __thiscall spv::Instruction::addStringOperand(Instruction *this,char *str)

{
  char cVar1;
  iterator iVar2;
  uint uVar3;
  uint uVar4;
  uint *__s;
  uint word;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  __s = &local_3c;
  uVar3 = 0;
  do {
    while( true ) {
      uVar4 = uVar3;
      cVar1 = *str;
      str = str + 1;
      *(char *)__s = cVar1;
      if (uVar4 + 1 != 4) break;
      local_38 = local_3c;
      iVar2._M_current =
           (this->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &this->operands,iVar2,&local_38);
      }
      else {
        *iVar2._M_current = local_3c;
        (this->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      __s = &local_3c;
      uVar3 = 0;
      if (cVar1 == '\0') {
        return;
      }
    }
    __s = (uint *)((long)__s + 1);
    uVar3 = uVar4 + 1;
  } while (cVar1 != '\0');
  if ((int)uVar4 < 0) {
    return;
  }
  if (uVar4 < 3) {
    memset(__s,0,(ulong)(3 - uVar4));
  }
  local_34 = local_3c;
  iVar2._M_current =
       (this->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current !=
      (this->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    *iVar2._M_current = local_3c;
    (this->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    return;
  }
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&this->operands,
             iVar2,&local_34);
  return;
}

Assistant:

void addStringOperand(const char* str)
    {
        unsigned int word;
        char* wordString = (char*)&word;
        char* wordPtr = wordString;
        int charCount = 0;
        char c;
        do {
            c = *(str++);
            *(wordPtr++) = c;
            ++charCount;
            if (charCount == 4) {
                addImmediateOperand(word);
                wordPtr = wordString;
                charCount = 0;
            }
        } while (c != 0);

        // deal with partial last word
        if (charCount > 0) {
            // pad with 0s
            for (; charCount < 4; ++charCount)
                *(wordPtr++) = 0;
            addImmediateOperand(word);
        }
    }